

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O1

bool __thiscall Json::Value::removeMember(Value *this,char *key,char *cend,Value *removed)

{
  ushort uVar1;
  ValueHolder VVar2;
  CommentInfo *pCVar3;
  ptrdiff_t pVar4;
  ptrdiff_t pVar5;
  iterator __position;
  bool bVar6;
  CZString actualKey;
  key_type local_58;
  ValueHolder local_48;
  ushort local_40;
  CommentInfo *local_38;
  ptrdiff_t local_30;
  ptrdiff_t pStack_28;
  
  if (this->field_0x8 == '\a') {
    local_58.field_1.index_ = ((int)cend - (int)key) * 4;
    local_58.cstr_ = key;
    __position = std::
                 _Rb_tree<Json::Value::CZString,_std::pair<const_Json::Value::CZString,_Json::Value>,_std::_Select1st<std::pair<const_Json::Value::CZString,_Json::Value>_>,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
                 ::find(&((this->value_).map_)->_M_t,&local_58);
    bVar6 = (_Rb_tree_header *)__position._M_node !=
            &(((this->value_).map_)->_M_t)._M_impl.super__Rb_tree_header;
    if (bVar6) {
      Value((Value *)&local_48,(Value *)&__position._M_node[1]._M_left);
      uVar1 = *(ushort *)&removed->field_0x8;
      *(ushort *)&removed->field_0x8 = uVar1 & 0xff00 | local_40 & 0xff;
      VVar2 = removed->value_;
      removed->value_ = local_48;
      *(ushort *)&removed->field_0x8 = uVar1 & 0xfe00 | local_40 & 0xff | local_40 & 0x100;
      local_40 = local_40 & 0xfe00 | uVar1 & 0xff | uVar1 & 0x100;
      pCVar3 = removed->comments_;
      removed->comments_ = local_38;
      pVar4 = removed->start_;
      pVar5 = removed->limit_;
      removed->start_ = local_30;
      removed->limit_ = pStack_28;
      local_48 = VVar2;
      local_38 = pCVar3;
      local_30 = pVar4;
      pStack_28 = pVar5;
      ~Value((Value *)&local_48);
      std::
      _Rb_tree<Json::Value::CZString,_std::pair<const_Json::Value::CZString,_Json::Value>,_std::_Select1st<std::pair<const_Json::Value::CZString,_Json::Value>_>,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
      ::_M_erase_aux(&((this->value_).map_)->_M_t,(const_iterator)__position._M_node);
    }
    if ((local_58.cstr_ != (char *)0x0) && ((local_58.field_1.index_ & 3) == 1)) {
      free(local_58.cstr_);
    }
  }
  else {
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

bool Value::removeMember(const char* key, const char* cend, Value* removed)
{
  if (type_ != objectValue) {
    return false;
  }
  CZString actualKey(key, static_cast<unsigned>(cend-key), CZString::noDuplication);
  ObjectValues::iterator it = value_.map_->find(actualKey);
  if (it == value_.map_->end())
    return false;
  *removed = it->second;
  value_.map_->erase(it);
  return true;
}